

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O2

int jpc_getuint32(jas_stream_t *in,uint_fast32_t *val)

{
  int iVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = in->flags_;
  if ((uVar6 & 7) != 0) {
    return -1;
  }
  if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
    iVar1 = in->cnt_;
    in->cnt_ = iVar1 + -1;
    if (iVar1 < 1) {
      uVar3 = jas_stream_fillbuf(in,1);
      if (uVar3 == 0xffffffff) {
        return -1;
      }
      uVar6 = in->flags_;
    }
    else {
      in->rwcnt_ = in->rwcnt_ + 1;
      pbVar2 = in->ptr_;
      in->ptr_ = pbVar2 + 1;
      uVar3 = (uint)*pbVar2;
    }
    if ((uVar6 & 7) != 0) {
      return -1;
    }
    if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
      iVar1 = in->cnt_;
      in->cnt_ = iVar1 + -1;
      if (iVar1 < 1) {
        uVar4 = jas_stream_fillbuf(in,1);
        if (uVar4 == 0xffffffff) {
          return -1;
        }
        uVar6 = in->flags_;
      }
      else {
        in->rwcnt_ = in->rwcnt_ + 1;
        pbVar2 = in->ptr_;
        in->ptr_ = pbVar2 + 1;
        uVar4 = (uint)*pbVar2;
      }
      if ((uVar6 & 7) != 0) {
        return -1;
      }
      if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
        iVar1 = in->cnt_;
        in->cnt_ = iVar1 + -1;
        if (iVar1 < 1) {
          uVar5 = jas_stream_fillbuf(in,1);
          if (uVar5 == 0xffffffff) {
            return -1;
          }
          uVar6 = in->flags_;
        }
        else {
          in->rwcnt_ = in->rwcnt_ + 1;
          pbVar2 = in->ptr_;
          in->ptr_ = pbVar2 + 1;
          uVar5 = (uint)*pbVar2;
        }
        if ((uVar6 & 7) != 0) {
          return -1;
        }
        if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
          iVar1 = in->cnt_;
          in->cnt_ = iVar1 + -1;
          if (iVar1 < 1) {
            uVar6 = jas_stream_fillbuf(in,1);
            if (uVar6 == 0xffffffff) {
              return -1;
            }
          }
          else {
            in->rwcnt_ = in->rwcnt_ + 1;
            pbVar2 = in->ptr_;
            in->ptr_ = pbVar2 + 1;
            uVar6 = (uint)*pbVar2;
          }
          if (val == (uint_fast32_t *)0x0) {
            return 0;
          }
          *val = (long)(int)uVar6 |
                 ((long)(int)uVar5 | (long)(int)uVar4 << 8 | (long)(int)uVar3 << 0x10) << 8;
          return 0;
        }
      }
    }
  }
  in->flags_ = uVar6 | 4;
  return -1;
}

Assistant:

int jpc_getuint32(jas_stream_t *in, uint_fast32_t *val)
{
	uint_fast32_t v;
	int c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = (v << 8) | c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = (v << 8) | c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = (v << 8) | c;
	if (val) {
		*val = v;
	}
	return 0;
}